

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O3

void __thiscall Refal2::COperationsBuilder::Reset(COperationsBuilder *this)

{
  CNodeType *fromNode;
  
  fromNode = (this->operations).first;
  if (fromNode != (CNodeType *)0x0) {
    CNodeList<Refal2::COperation>::Remove(&this->operations,fromNode,(this->operations).last);
  }
  this->savedOperation = (COperationNode *)0x0;
  this->stackDepth = 0;
  this->maxStackDepth = 0;
  (this->operations).first = (CNodeType *)0x0;
  (this->operations).last = (CNodeType *)0x0;
  this->maxRuleStackDepth = 0;
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchLeftSaveToTable_W : OT_MatchLeft_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchLeftWithQualifierSaveToTable_W :
			OT_MatchLeftWithQualifier_W ), qualifier );
	}
}